

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj2.c
# Opt level: O2

int Maj_ManExactSynthesis2
              (int nVars,int nNodes,int fUseConst,int fUseLine,int fUseRand,int nRands,int fVerbose)

{
  ulong uVar1;
  byte bVar2;
  int (*paiVar3) [32];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Maj_Man_t_conflict *p;
  Vec_Wec_t *p_00;
  clock_t cVar8;
  int (*paaiVar9) [3] [32];
  Vec_Wrd_t *pVVar10;
  word *pwVar11;
  sat_solver *s;
  Vec_Int_t *pVVar12;
  abctime aVar13;
  ulong uVar14;
  lit *end;
  abctime time;
  abctime time_00;
  uint uVar15;
  long lVar16;
  int (*paaiVar17) [3] [32];
  int iVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  char *pcVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  int iVar25;
  int *piVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  int iMint;
  int (*local_208) [3] [32];
  int (*local_200) [3] [32];
  int *local_1f8;
  int (*local_1f0) [3] [32];
  int (*local_1e8) [3] [32];
  ulong local_1e0;
  int local_1d8;
  int local_1d4;
  int (*local_1d0) [3] [32];
  int (*local_1c8) [3] [32];
  abctime local_1c0;
  int pLits [32];
  
  iMint = 0;
  local_1c0 = Abc_Clock();
  p = (Maj_Man_t_conflict *)calloc(1,0x30c8);
  p->nVars = nVars;
  p->nNodes = nNodes;
  iVar4 = nVars + nNodes + 2;
  p->nObjs = iVar4;
  p->fUseConst = fUseConst;
  p->fUseLine = fUseLine;
  p->fUseRand = fUseRand;
  p->fVerbose = fVerbose;
  p->nRands = nRands;
  iVar7 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar7 = 1;
  }
  p->nWords = iVar7;
  p_00 = Vec_WecStart(iVar4);
  p->vOutLits = p_00;
  memset(pLits,0,0x180);
  p->iVar = 1;
  if (0x20 < iVar4) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                  ,0xa1,"int Maj_ManMarkup(Maj_Man_t *)");
  }
  iVar7 = nVars + 2;
  if (fUseRand != 0) {
    cVar8 = clock();
    srand((uint)cVar8);
    uVar24 = nNodes + nVars;
LAB_004a6446:
    if (iVar7 <= (int)uVar24) {
      do {
        iVar5 = rand();
        iVar5 = iVar5 % (int)(~uVar24 + iVar4) + uVar24 + 1;
        uVar28 = 2;
        while (uVar14 = uVar28, -1 < (int)uVar14) {
          uVar28 = (ulong)((int)uVar14 - 1);
          if (pLits[(long)iVar5 * 3 + uVar14] == 0) {
            pLits[(long)iVar5 * 3 + uVar14] = uVar24;
            if (fVerbose != 0) {
              printf("%d -> %d  ");
            }
            uVar24 = uVar24 - 1;
            goto LAB_004a6446;
          }
        }
      } while( true );
    }
    iVar4 = nVars + nNodes + 1;
    local_208 = (int (*) [3] [32])CONCAT44(local_208._4_4_,iVar4);
    local_1f0 = (int (*) [3] [32])CONCAT44(local_1f0._4_4_,iVar4 - iVar7);
    for (iVar4 = 0; iVar4 < nRands; iVar4 = (iVar4 - (uint)(iVar18 == 100)) + 1) {
      iVar5 = rand();
      iVar5 = iVar5 % (int)local_1f0;
      iVar25 = iVar5 + iVar7;
      iVar27 = (int)local_208 - iVar25;
      for (iVar18 = 0; iVar18 != 100; iVar18 = iVar18 + 1) {
        iVar6 = rand();
        iVar6 = iVar6 % iVar27 + iVar5 + iVar7 + 1;
        uVar24 = 2;
        while (uVar15 = uVar24, -1 < (int)uVar15) {
          if (pLits[(long)iVar6 * 3 + (ulong)uVar15] == iVar25) break;
          uVar24 = uVar15 - 1;
          if (pLits[(long)iVar6 * 3 + (ulong)uVar15] == 0) {
            pLits[(long)iVar6 * 3 + (ulong)uVar15] = iVar25;
            if (fVerbose != 0) {
              printf("+%d -> %d  ");
            }
            goto LAB_004a654a;
          }
        }
      }
LAB_004a654a:
    }
    if (fVerbose != 0) {
      putchar(10);
    }
  }
  local_1f0 = p->VarMarks;
  piVar26 = p->VarMarks[iVar7][0] + 4;
  for (lVar16 = 4; lVar16 != 1; lVar16 = lVar16 + -1) {
    iVar7 = p->iVar;
    iVar4 = Abc_Var2Lit(iVar7,0);
    Vec_WecPush(p_00,(int)lVar16,iVar4);
    p->iVar = iVar7 + 1;
    *piVar26 = iVar7;
    piVar26 = piVar26 + 0x1f;
  }
  lVar16 = (long)(p->nVars + 3);
  paaiVar9 = p->VarMarks + lVar16;
  while( true ) {
    iVar7 = p->nObjs;
    paaiVar17 = (int (*) [3] [32])(long)iVar7;
    if ((long)paaiVar17 <= lVar16) break;
    local_1f8 = (int *)(lVar16 * 0x180);
    local_208 = local_1f0 + lVar16;
    local_200 = paaiVar9;
    for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
      if ((lVar22 == 0) && (p->fUseLine != 0)) {
        iVar7 = p->iVar;
        iVar4 = Abc_Var2Lit(iVar7,0);
        Vec_WecPush(p_00,(int)lVar16 + -1,iVar4);
        p->iVar = iVar7 + 1;
        *(int *)((long)(local_208 + -1) + 0x17c + lVar16 * 4) = iVar7;
      }
      else {
        iVar7 = p->fUseRand;
        if (iVar7 != 0) {
          iVar4 = pLits[lVar16 * 3 + lVar22];
          if (0 < (long)iVar4) {
            iVar7 = p->iVar;
            iVar5 = Abc_Var2Lit(iVar7,0);
            Vec_WecPush(p_00,iVar4,iVar5);
            p->iVar = iVar7 + 1;
            *(int *)((long)(*local_1f0)[lVar22] + (long)(local_1f8 + iVar4)) = iVar7;
            goto LAB_004a66c9;
          }
        }
        uVar28 = (ulong)((uint)(p->fUseConst == 0) * 2);
        if (lVar22 != 2) {
          uVar28 = 2;
        }
        while( true ) {
          iVar4 = (int)lVar16;
          if (iVar7 != 0) {
            iVar4 = p->nVars + 2;
          }
          if ((long)(iVar4 - (int)lVar22) <= (long)uVar28) break;
          iVar7 = p->iVar;
          iVar4 = Abc_Var2Lit(iVar7,0);
          Vec_WecPush(p_00,(int)uVar28,iVar4);
          p->iVar = iVar7 + 1;
          (*paaiVar9)[0][uVar28] = iVar7;
          uVar28 = uVar28 + 1;
          iVar7 = p->fUseRand;
        }
      }
LAB_004a66c9:
      paaiVar9 = (int (*) [3] [32])(*paaiVar9 + 1);
    }
    lVar16 = lVar16 + 1;
    paaiVar9 = local_200 + 1;
  }
  iVar4 = p->iVar;
  printf("The number of parameter variables = %d.\n");
  if (p->fVerbose == 0) {
    iVar5 = p->nVars;
  }
  else {
    printf("     ");
    uVar24 = p->nVars;
    iVar18 = uVar24 + 2;
    for (iVar5 = iVar18; iVar5 < iVar7; iVar5 = iVar5 + 1) {
      printf("   Node %2d    ");
    }
    local_1d0 = (int (*) [3] [32])CONCAT44(local_1d0._4_4_,iVar4);
    putchar(10);
    local_1e8 = (int (*) [3] [32])(long)iVar18;
    local_200 = (int (*) [3] [32])0x0;
    if (0 < (long)paaiVar17) {
      local_200 = paaiVar17;
    }
    local_1f8 = p->VarMarks[(long)(local_1e8 + -1) + 0x17f][2] + 0x14;
    local_1e0 = (ulong)uVar24;
    for (puVar20 = (undefined1 *)0x0; iVar5 = (int)local_1e0, (int (*) [3] [32])puVar20 != local_200
        ; puVar20 = puVar20 + 1) {
      printf("%2d : ");
      paaiVar9 = local_1e8;
      piVar26 = local_1f8;
      while ((long)paaiVar9 < (long)paaiVar17) {
        local_208 = paaiVar9;
        for (puVar19 = (undefined1 *)0x0; (int (*) [3] [32])puVar19 != paaiVar17;
            puVar19 = puVar19 + 1) {
          if (puVar19 == puVar20) {
            for (lVar16 = 0x30; lVar16 != 0x1b0; lVar16 = lVar16 + 0x80) {
              uVar28 = (ulong)*(uint *)((long)piVar26 + lVar16);
              if (*(uint *)((long)piVar26 + lVar16) == 0) {
                pcVar21 = "%3c ";
                uVar28 = 0x2e;
              }
              else {
                pcVar21 = "%3d ";
              }
              printf(pcVar21,uVar28);
            }
            printf("  ");
          }
        }
        piVar26 = piVar26 + 0x60;
        paaiVar9 = (int (*) [3] [32])((long)(*local_208)[0] + 1);
      }
      putchar(10);
      local_1f8 = local_1f8 + 1;
    }
    iVar4 = (int)local_1d0;
  }
  p->VarVals[1] = 1;
  uVar24 = p->nWords;
  pVVar10 = Vec_WrdStart((iVar7 + 1) * uVar24);
  p->vInfo = pVVar10;
  pwVar11 = Maj_ManTruth(p,1);
  uVar14 = 0;
  uVar28 = (ulong)uVar24;
  if ((int)uVar24 < 1) {
    uVar28 = uVar14;
  }
  for (; uVar28 != uVar14; uVar14 = uVar14 + 1) {
    pwVar11[uVar14] = 0xffffffffffffffff;
  }
  iVar25 = 0;
  iVar18 = 0;
  if (0 < iVar5) {
    iVar18 = iVar5;
  }
  while (bVar29 = iVar18 != 0, iVar18 = iVar18 + -1, bVar29) {
    pwVar11 = Maj_ManTruth(p,iVar25 + 2);
    Abc_TtIthVar(pwVar11,iVar25,iVar5);
    iVar25 = iVar25 + 1;
  }
  bVar2 = (byte)iVar5 & 0x1f;
  uVar15 = 1 << bVar2;
  uVar24 = 0x40;
  if (0x40 < (int)uVar15) {
    uVar24 = uVar15;
  }
  for (uVar15 = 0 << bVar2; uVar24 != uVar15; uVar15 = uVar15 + 1) {
    iVar18 = Maj_ManValue(uVar15,iVar5);
    if (iVar18 != 0) {
      pwVar11 = Maj_ManTruth(p,iVar7);
      pwVar11[uVar15 >> 6] = pwVar11[uVar15 >> 6] | 1L << ((byte)uVar15 & 0x3f);
    }
  }
  p->vInfo = pVVar10;
  s = sat_solver_new();
  p->pSat = s;
  sat_solver_setnvars(s,iVar4);
  uVar28 = (ulong)(p->nVars + 2);
  local_1d0 = p->VarMarks + uVar28;
  local_1c8 = (int (*) [3] [32])(p->VarMarks[uVar28] + 1);
  while ((long)uVar28 < (long)p->nObjs) {
    local_1e8 = local_1c8;
    local_208 = local_1d0;
    paaiVar9 = (int (*) [3] [32])0x0;
    local_1e0 = uVar28;
    while (paaiVar9 != (int (*) [3] [32])0x3) {
      uVar28 = 0;
      local_200 = paaiVar9;
      for (lVar16 = 0; iVar7 = (int)uVar28, lVar16 < p->nObjs; lVar16 = lVar16 + 1) {
        iVar4 = (*local_208)[0][lVar16];
        if (iVar4 != 0) {
          iVar4 = Abc_Var2Lit(iVar4,0);
          uVar28 = (ulong)(iVar7 + 1);
          pLits[iVar7] = iVar4;
        }
      }
      if (iVar7 < 1) {
        __assert_fail("nLits > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                      ,0x177,"int Maj_ManAddCnfStart(Maj_Man_t *)");
      }
      iVar4 = sat_solver_addclause(p->pSat,pLits,pLits + uVar28);
      if (iVar4 == 0) goto LAB_004a6c9a;
      lVar16 = 1;
      uVar14 = 0;
      while (paaiVar9 = local_200, uVar14 != uVar28) {
        lVar22 = lVar16;
        while ((int)lVar22 < iVar7) {
          local_1d8 = Abc_LitNot(pLits[uVar14]);
          local_1d4 = Abc_LitNot(pLits[lVar22]);
          iVar4 = sat_solver_addclause(p->pSat,&local_1d8,(lit *)&local_1d0);
          lVar22 = lVar22 + 1;
          if (iVar4 == 0) goto LAB_004a6c9a;
        }
        lVar16 = lVar16 + 1;
        uVar14 = uVar14 + 1;
      }
      if (local_200 != (int (*) [3] [32])0x2) {
        local_1f8 = (int *)(local_1e0 * 0x180);
        if ((local_1f0[local_1e0][(long)local_200][2] != 0) &&
           (local_1f0[local_1e0][(long)((long)(*local_200)[0] + 1)][2] != 0)) {
          iVar7 = p->nObjs;
          paaiVar17 = local_1e8;
          for (lVar16 = 0; lVar16 < iVar7; lVar16 = lVar16 + 1) {
            if (*(int *)((long)(*local_1f0)[(long)paaiVar9] + (long)(local_1f8 + lVar16)) != 0) {
              paiVar3 = *local_1f0;
              piVar26 = local_1f8 + lVar16;
              for (lVar22 = 0; lVar22 + lVar16 < (long)iVar7; lVar22 = lVar22 + 1) {
                if ((*paaiVar17)[0][lVar22] != 0) {
                  local_1d8 = Abc_Var2Lit(*(int *)((long)paiVar3[(long)paaiVar9] + (long)piVar26),1)
                  ;
                  local_1d4 = Abc_Var2Lit((*paaiVar17)[0][lVar22],1);
                  iVar7 = sat_solver_addclause(p->pSat,&local_1d8,(lit *)&local_1d0);
                  if (iVar7 == 0) goto LAB_004a6c9a;
                  iVar7 = p->nObjs;
                }
              }
            }
            paaiVar17 = (int (*) [3] [32])((*paaiVar17)[0] + 1);
          }
        }
      }
      local_208 = (int (*) [3] [32])(*local_208 + 1);
      local_1e8 = (int (*) [3] [32])(*local_1e8 + 1);
      paaiVar9 = (int (*) [3] [32])((long)(*local_200)[0] + 1);
    }
    local_1d0 = local_1d0 + 1;
    local_1c8 = local_1c8 + 1;
    uVar28 = local_1e0 + 1;
  }
  iVar7 = 2;
  while (iVar7 < p->nObjs + -1) {
    pVVar12 = Vec_WecEntry(p->vOutLits,iVar7);
    if ((long)pVVar12->nSize < 1) {
      __assert_fail("Vec_IntSize(vArray) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x194,"int Maj_ManAddCnfStart(Maj_Man_t *)");
    }
    iVar4 = sat_solver_addclause(p->pSat,pVVar12->pArray,pVVar12->pArray + pVVar12->nSize);
    iVar7 = iVar7 + 1;
    if (iVar4 == 0) {
LAB_004a6c9a:
      __assert_fail("status",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x1d4,"int Maj_ManExactSynthesis2(int, int, int, int, int, int, int)");
    }
  }
  if (fVerbose != 0) {
    printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
           (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  }
  uVar28 = (ulong)(uint)iMint;
  local_208 = (int (*) [3] [32])((ulong)local_208 & 0xffffffff00000000);
  do {
    if ((int)uVar28 == -1) {
LAB_004a7210:
      printf("Realization of %d-input majority using %d MAJ3 gates:\n",(ulong)(uint)p->nVars,
             (ulong)(uint)p->nNodes);
      iVar7 = p->nObjs;
      while (p->nVars + 2 < iVar7) {
        printf("%02d = MAJ(",(ulong)(iVar7 - 3));
        for (iVar4 = 2; -1 < iVar4; iVar4 = iVar4 + -1) {
          uVar24 = Maj_ManFindFanin(p,iVar7 + -1,iVar4);
          if ((int)uVar24 < 2) {
            pcVar21 = " %d";
          }
          else if ((int)uVar24 < p->nVars + 2) {
            uVar24 = uVar24 + 0x5f;
            pcVar21 = " %c";
          }
          else {
            uVar24 = uVar24 - 2;
            pcVar21 = " %02d";
          }
          printf(pcVar21,(ulong)uVar24);
        }
        puts(" )");
        iVar7 = iVar7 + -1;
      }
LAB_004a71b2:
      sat_solver_delete(p->pSat);
      Vec_WrdFree(p->vInfo);
      Vec_WecFree(p->vOutLits);
      free(p);
      aVar13 = Abc_Clock();
      Abc_PrintTime(0x7a9015,(char *)(aVar13 - local_1c0),time_00);
      return (int)(iMint == -1);
    }
    local_1e0 = Abc_Clock();
    iVar7 = iMint;
    uVar24 = p->nVars;
    iVar4 = Maj_ManValue(iMint,uVar24);
    local_200 = (int (*) [3] [32])CONCAT44(local_200._4_4_,iVar4);
    if ((int)uVar24 < 1) {
      uVar24 = 0;
    }
    for (uVar28 = 0; uVar24 != uVar28; uVar28 = uVar28 + 1) {
      p->VarVals[uVar28 + 2] = (uint)(((uint)iVar7 >> ((uint)uVar28 & 0x1f) & 1) != 0);
    }
    sat_solver_setnvars(p->pSat,p->nNodes * 4 + p->iVar);
    lVar16 = (long)(p->nVars + 2);
    while( true ) {
      uVar28 = (ulong)p->nObjs;
      if ((long)uVar28 <= lVar16) break;
      iVar7 = (int)lVar16;
      local_1f8 = (int *)(ulong)((p->iVar + (iVar7 - p->nVars) * 4) - 8);
      for (lVar22 = 0; iVar4 = (int)local_1f8, lVar22 != 3; lVar22 = lVar22 + 1) {
        for (lVar23 = 0; lVar23 < (int)uVar28; lVar23 = lVar23 + 1) {
          if (local_1f0[lVar16][lVar22][lVar23] != 0) {
            paaiVar9 = local_1f0 + lVar16;
            iVar5 = p->iVar;
            iVar18 = p->nVars;
            for (uVar24 = 0; uVar24 != 2; uVar24 = uVar24 + 1) {
              pLits[0] = Abc_Var2Lit((*paaiVar9)[lVar22][lVar23],1);
              pLits[1] = Abc_Var2Lit(iVar4 + (int)lVar22,uVar24);
              if (lVar23 + -2 < (long)p->nVars) {
                end = pLits + 2;
                if (uVar24 != p->VarVals[lVar23]) goto LAB_004a6e47;
              }
              else {
                pLits[2] = Abc_Var2Lit(iVar5 + ((int)lVar23 - iVar18) * 4 + -5,uVar24 ^ 1);
                end = pLits + 3;
LAB_004a6e47:
                iVar25 = sat_solver_addclause(p->pSat,pLits,end);
                if (iVar25 == 0) goto LAB_004a7197;
              }
            }
            uVar28 = (ulong)(uint)p->nObjs;
          }
        }
      }
      local_1e8 = (int (*) [3] [32])CONCAT44(local_1e8._4_4_,iVar4 + 3);
      for (uVar24 = 0; uVar24 != 2; uVar24 = uVar24 + 1) {
        if ((p->nObjs + -1 != iVar7) || (uVar24 != (uint)local_200)) {
          iVar5 = 0;
          while (iVar5 != 3) {
            if (iVar5 == 0) {
              uVar28 = 0;
LAB_004a6f01:
              iVar18 = Abc_Var2Lit(iVar4 + 1,uVar24);
              uVar14 = (ulong)((int)uVar28 + 1);
              pLits[uVar28] = iVar18;
              uVar28 = uVar14;
              if (iVar5 != 2) goto LAB_004a6f1c;
            }
            else {
              pLits[0] = Abc_Var2Lit((int)local_1f8,uVar24);
              uVar28 = 1;
              if (iVar5 != 1) goto LAB_004a6f01;
LAB_004a6f1c:
              iVar18 = Abc_Var2Lit(iVar4 + 2,uVar24);
              uVar14 = (ulong)((int)uVar28 + 1);
              pLits[uVar28] = iVar18;
            }
            if (p->nObjs + -1 != iVar7) {
              iVar18 = Abc_Var2Lit((int)local_1e8,uVar24 ^ 1);
              pLits[uVar14] = iVar18;
              if (2 < (uint)uVar14) {
                __assert_fail("nLits <= 3",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                              ,0x1c5,"int Maj_ManAddCnf(Maj_Man_t *, int)");
              }
              uVar14 = (ulong)((uint)uVar14 + 1);
            }
            iVar18 = sat_solver_addclause(p->pSat,pLits,pLits + uVar14);
            iVar5 = iVar5 + 1;
            if (iVar18 == 0) goto LAB_004a7197;
          }
        }
      }
      lVar16 = lVar16 + 1;
    }
    p->iVar = p->iVar + p->nNodes * 4;
    iVar7 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
    if (fVerbose != 0) {
      printf("Iter %3d : ",(ulong)local_208 & 0xffffffff);
      Extra_PrintBinary(_stdout,(uint *)&iMint,p->nVars);
      printf("  Var =%5d  ",(ulong)(uint)p->iVar);
      uVar24 = sat_solver_nclauses(p->pSat);
      printf("Cla =%6d  ",(ulong)uVar24);
      uVar24 = sat_solver_nconflicts(p->pSat);
      printf("Conf =%9d  ",(ulong)uVar24);
      aVar13 = Abc_Clock();
      Abc_PrintTime(0x82525c,(char *)(aVar13 - local_1e0),time);
    }
    if (iVar7 == -1) {
LAB_004a7197:
      printf("The problem has no solution after %2d iterations.  ",(ulong)((int)local_208 + 1));
      if (iMint != -1) goto LAB_004a71b2;
      goto LAB_004a7210;
    }
    for (iVar7 = p->nVars + 2; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
      for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
        iVar4 = Maj_ManFindFanin(p,iVar7,(int)lVar16);
        pwVar11 = Maj_ManTruth(p,iVar4);
        *(word **)(pLits + lVar16 * 2) = pwVar11;
      }
      pwVar11 = Maj_ManTruth(p,iVar7);
      uVar24 = p->nWords;
      if (p->nWords < 1) {
        uVar24 = 0;
      }
      for (uVar28 = 0; uVar24 != uVar28; uVar28 = uVar28 + 1) {
        uVar14 = *(ulong *)(CONCAT44(pLits[3],pLits[2]) + uVar28 * 8);
        uVar1 = *(ulong *)(pLits._16_8_ + uVar28 * 8);
        pwVar11[uVar28] =
             uVar1 & uVar14 |
             (uVar1 | uVar14) & *(ulong *)(CONCAT44(pLits[1],pLits[0]) + uVar28 * 8);
      }
    }
    uVar28 = 0;
    while( true ) {
      iVar7 = 1 << ((byte)p->nVars & 0x1f);
      if (iVar7 <= (int)uVar28) break;
      iVar7 = p->nVars / 2;
      if (Abc_TtBitCount8[uVar28 >> 8] + Abc_TtBitCount8[uVar28 & 0xff] <= iVar7 + 1 &&
          iVar7 <= Abc_TtBitCount8[uVar28 >> 8] + Abc_TtBitCount8[uVar28 & 0xff]) {
        pwVar11 = Maj_ManTruth(p,p->nObjs);
        uVar14 = pwVar11[uVar28 >> 6];
        pwVar11 = Maj_ManTruth(p,p->nObjs + -1);
        if (((uVar14 ^ pwVar11[uVar28 >> 6]) >> (uVar28 & 0x3f) & 1) != 0) {
          iVar7 = 1 << ((byte)p->nVars & 0x1f);
          goto LAB_004a717d;
        }
      }
      uVar28 = (ulong)((int)uVar28 + 1);
    }
    uVar28 = 0xffffffff;
LAB_004a717d:
    if (iVar7 <= (int)uVar28) {
      __assert_fail("iMint < (1 << p->nVars)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj2.c"
                    ,0x13a,"int Maj_ManEval(Maj_Man_t *)");
    }
    local_208 = (int (*) [3] [32])CONCAT44(local_208._4_4_,(int)local_208 + 1);
    iMint = (int)uVar28;
  } while( true );
}

Assistant:

int Maj_ManExactSynthesis2( int nVars, int nNodes, int fUseConst, int fUseLine, int fUseRand, int nRands, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine, fUseRand, nRands, fVerbose );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    if ( fVerbose )
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
        {
            printf( "The problem has no solution after %2d iterations.  ", i+1 );
            break;
        }
        status = sat_solver_solve( p->pSat, NULL, NULL, 0, 0, 0, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", sat_solver_nclauses(p->pSat) );
            printf( "Conf =%9d  ", sat_solver_nconflicts(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == l_False )
        {
            printf( "The problem has no solution after %2d iterations.  ", i+1 );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}